

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void sgrproj_filter_stripe
               (RestorationUnitInfo *rui,int stripe_width,int stripe_height,int procunit_width,
               uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int32_t *tmpbuf,int bit_depth
               ,aom_internal_error_info *error_info)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  if (0 < stripe_width) {
    lVar3 = 0;
    iVar2 = stripe_width;
    do {
      iVar1 = iVar2;
      if (procunit_width <= iVar2) {
        iVar1 = procunit_width;
      }
      iVar1 = (*av1_apply_selfguided_restoration)
                        (src + lVar3,iVar1,stripe_height,src_stride,(rui->sgrproj_info).ep,
                         (rui->sgrproj_info).xqd,dst + lVar3,dst_stride,tmpbuf,bit_depth,0);
      if (iVar1 != 0) {
        aom_internal_error(error_info,AOM_CODEC_MEM_ERROR,
                           "Error allocating buffer in av1_apply_selfguided_restoration");
      }
      lVar3 = lVar3 + procunit_width;
      iVar2 = iVar2 - procunit_width;
    } while (lVar3 < (long)(ulong)(uint)stripe_width);
  }
  return;
}

Assistant:

static void sgrproj_filter_stripe(const RestorationUnitInfo *rui,
                                  int stripe_width, int stripe_height,
                                  int procunit_width, const uint8_t *src,
                                  int src_stride, uint8_t *dst, int dst_stride,
                                  int32_t *tmpbuf, int bit_depth,
                                  struct aom_internal_error_info *error_info) {
  (void)bit_depth;
  assert(bit_depth == 8);

  for (int j = 0; j < stripe_width; j += procunit_width) {
    int w = AOMMIN(procunit_width, stripe_width - j);
    if (av1_apply_selfguided_restoration(
            src + j, w, stripe_height, src_stride, rui->sgrproj_info.ep,
            rui->sgrproj_info.xqd, dst + j, dst_stride, tmpbuf, bit_depth,
            0) != 0) {
      aom_internal_error(
          error_info, AOM_CODEC_MEM_ERROR,
          "Error allocating buffer in av1_apply_selfguided_restoration");
    }
  }
}